

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool int_loop(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *closure;
  long lVar1;
  _Bool _Var2;
  gravity_fiber_t *fiber;
  nanotime_t nVar3;
  nanotime_t nVar4;
  long lVar5;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar6;
  gravity_value_t value;
  gravity_value_t gVar7;
  gravity_value_t local_1048;
  char _buffer [4096];
  
  if (nargs < 2) {
    builtin_strncpy(_buffer + 0x10," of arguments.",0xf);
    _buffer[0] = 'I';
    _buffer[1] = 'n';
    _buffer[2] = 'c';
    _buffer[3] = 'o';
    _buffer[4] = 'r';
    _buffer[5] = 'r';
    _buffer[6] = 'e';
    _buffer[7] = 'c';
    _buffer[8] = 't';
    _buffer[9] = ' ';
    _buffer[10] = 'n';
    _buffer[0xb] = 'u';
    _buffer[0xc] = 'm';
    _buffer[0xd] = 'b';
    _buffer[0xe] = 'e';
    _buffer[0xf] = 'r';
  }
  else {
    if (args[1].isa == gravity_class_closure) {
      closure = args[1].field_1.p;
      lVar1 = (args->field_1).n;
      gVar7 = *args;
      nVar3 = nanotime();
      aVar6.n = 0;
      lVar5 = 0;
      if (0 < lVar1) {
        lVar5 = lVar1;
      }
      do {
        if (lVar5 == aVar6.n) {
          nVar4 = nanotime();
          gVar7.field_1.p = (gravity_object_t *)(nVar4 - nVar3);
          gVar7.isa = gravity_class_int;
          gravity_vm_setslot(vm,gVar7,rindex);
          return true;
        }
        local_1048.isa = gravity_class_int;
        local_1048.field_1 = aVar6;
        _Var2 = gravity_vm_runclosure(vm,(gravity_closure_t *)closure,gVar7,&local_1048,1);
        aVar6.p = (gravity_object_t *)((long)&(aVar6.p)->isa + 1);
      } while (_Var2);
      return false;
    }
    builtin_strncpy(_buffer + 0x10," a Closure.",0xc);
    _buffer[0] = 'A';
    _buffer[1] = 'r';
    _buffer[2] = 'g';
    _buffer[3] = 'u';
    _buffer[4] = 'm';
    _buffer[5] = 'e';
    _buffer[6] = 'n';
    _buffer[7] = 't';
    _buffer[8] = ' ';
    _buffer[9] = 'm';
    _buffer[10] = 'u';
    _buffer[0xb] = 's';
    _buffer[0xc] = 't';
    _buffer[0xd] = ' ';
    _buffer[0xe] = 'b';
    _buffer[0xf] = 'e';
  }
  fiber = gravity_vm_fiber(vm);
  gravity_fiber_seterror(fiber,_buffer);
  value.field_1.n = 0;
  value.isa = gravity_class_null;
  gravity_vm_setslot(vm,value,rindex);
  return false;
}

Assistant:

static bool int_loop (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs < 2) RETURN_ERROR("Incorrect number of arguments.");
    if (!VALUE_ISA_CLOSURE(GET_VALUE(1))) RETURN_ERROR("Argument must be a Closure.");

    gravity_closure_t *closure = VALUE_AS_CLOSURE(GET_VALUE(1));    // closure to execute
    gravity_value_t value = GET_VALUE(0);                           // self parameter
    register gravity_int_t n = value.n;                             // times to execute the loop
    register gravity_int_t i = 0;

    nanotime_t t1 = nanotime();
    while (i < n) {
        if (!gravity_vm_runclosure(vm, closure, value, &VALUE_FROM_INT(i), 1)) return false;
        ++i;
    }
    nanotime_t t2 = nanotime();
    RETURN_VALUE(VALUE_FROM_INT(t2-t1), rindex);
}